

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_utils.hpp
# Opt level: O2

void __thiscall
boost::certify::store_ctx::store_ctx
          (store_ctx *this,certificate_chain *chain,certificate_store *store)

{
  bool bVar1;
  int iVar2;
  _Head_base<0UL,_x509_store_ctx_st_*,_false> _Var3;
  X509 *x509;
  ulong uVar4;
  error_code ec;
  error_code ec_00;
  system_error sStack_58;
  
  _Var3._M_head_impl = (x509_store_ctx_st *)X509_STORE_CTX_new();
  (this->handle_)._M_t.super___uniq_ptr_impl<x509_store_ctx_st,_boost::certify::store_ctx::free>.
  _M_t.super__Tuple_impl<0UL,_x509_store_ctx_st_*,_boost::certify::store_ctx::free>.
  super__Head_base<0UL,_x509_store_ctx_st_*,_false>._M_head_impl = _Var3._M_head_impl;
  if ((X509_STORE_CTX *)_Var3._M_head_impl == (X509_STORE_CTX *)0x0) {
    uVar4 = ERR_get_error();
    bVar1 = system::detail::failed_impl
                      ((int)uVar4,(error_category *)asio::error::get_ssl_category()::instance);
    ec._0_8_ = (ulong)bVar1 << 0x20 | uVar4 & 0xffffffff;
    ec.cat_ = (error_category *)asio::error::get_ssl_category()::instance;
    system::system_error::system_error(&sStack_58,ec);
    throw_exception<boost::system::system_error>(&sStack_58);
  }
  x509 = (X509 *)OPENSSL_sk_value((chain->handle_)._M_t.
                                  super___uniq_ptr_impl<stack_st_X509,_boost::certify::certificate_chain::chain_free>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_stack_st_X509_*,_boost::certify::certificate_chain::chain_free>
                                  .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,0);
  iVar2 = X509_STORE_CTX_init((X509_STORE_CTX *)
                              (this->handle_)._M_t.
                              super___uniq_ptr_impl<x509_store_ctx_st,_boost::certify::store_ctx::free>
                              ._M_t.
                              super__Tuple_impl<0UL,_x509_store_ctx_st_*,_boost::certify::store_ctx::free>
                              .super__Head_base<0UL,_x509_store_ctx_st_*,_false>._M_head_impl,
                              (X509_STORE *)
                              (store->handle_)._M_t.
                              super___uniq_ptr_impl<x509_store_st,_boost::certify::certificate_store::free>
                              ._M_t.
                              super__Tuple_impl<0UL,_x509_store_st_*,_boost::certify::certificate_store::free>
                              .super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl,x509,
                              (stack_st_X509 *)
                              (chain->handle_)._M_t.
                              super___uniq_ptr_impl<stack_st_X509,_boost::certify::certificate_chain::chain_free>
                              ._M_t.
                              super__Tuple_impl<0UL,_stack_st_X509_*,_boost::certify::certificate_chain::chain_free>
                              .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
  if (iVar2 == 1) {
    X509_STORE_CTX_set_verify_cb
              ((X509_STORE_CTX *)
               (this->handle_)._M_t.
               super___uniq_ptr_impl<x509_store_ctx_st,_boost::certify::store_ctx::free>._M_t.
               super__Tuple_impl<0UL,_x509_store_ctx_st_*,_boost::certify::store_ctx::free>.
               super__Head_base<0UL,_x509_store_ctx_st_*,_false>._M_head_impl,
               verify_server_certificates);
    return;
  }
  uVar4 = ERR_get_error();
  bVar1 = system::detail::failed_impl
                    ((int)uVar4,(error_category *)asio::error::get_ssl_category()::instance);
  ec_00._0_8_ = (ulong)bVar1 << 0x20 | uVar4 & 0xffffffff;
  ec_00.cat_ = (error_category *)asio::error::get_ssl_category()::instance;
  system::system_error::system_error(&sStack_58,ec_00);
  throw_exception<boost::system::system_error>(&sStack_58);
}

Assistant:

explicit store_ctx(certificate_chain& chain, certificate_store& store)
      : handle_{::X509_STORE_CTX_new()}
    {
        system::error_code ec;
        if (handle_ == nullptr)
        {
            ec = {static_cast<int>(::ERR_get_error()),
                  boost::asio::error::get_ssl_category()};
            boost::throw_exception(system::system_error{ec});
        }

        X509* const cert = sk_X509_value(chain.native_handle(), 0);
        auto const ret = ::X509_STORE_CTX_init(
          handle_.get(), store.native_handle(), cert, chain.native_handle());
        if (ret != 1)
        {

            ec = {static_cast<int>(::ERR_get_error()),
                  boost::asio::error::get_ssl_category()};
            boost::throw_exception(system::system_error{ec});
        }
        ::X509_STORE_CTX_set_verify_cb(handle_.get(),
                                       &detail::verify_server_certificates);
    }